

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_size_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  BaseType BVar1;
  uint uVar2;
  bool bVar3;
  uint32_t columns;
  uint32_t uVar4;
  CompilerError *this_00;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  bool bVar8;
  
  if ((type->pointer == true) && (type->storage == PhysicalStorageBuffer)) {
    uVar7 = (uint)(type->array).super_VectorView<unsigned_int>.buffer_size;
    bVar3 = Compiler::is_pointer((Compiler *)this,type);
    uVar6 = 8;
    if (0 < (int)uVar7) {
      do {
        if (bVar3 != false) {
          return uVar6;
        }
        uVar4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,uVar7 - 1);
        uVar6 = uVar4 * uVar6;
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id);
        bVar3 = Compiler::is_pointer((Compiler *)this,type);
        bVar8 = 1 < uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar8);
    }
  }
  else {
    BVar1 = type->basetype;
    if ((BVar1 < AccelerationStructure) &&
       ((0x70803U >> (BVar1 & (MeshGridProperties|Int)) & 1) != 0)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Querying size of opaque object.");
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      if (BVar1 == Struct) {
        uVar6 = get_declared_struct_size_msl(this,type,false,false);
        return uVar6;
      }
      uVar7 = type->vecsize;
      uVar5 = type->columns;
      if (!is_packed) {
        uVar2 = uVar5;
        if (row_major && 1 < uVar5) {
          uVar2 = uVar7;
          uVar7 = uVar5;
        }
        uVar5 = 4;
        if (uVar7 != 3) {
          uVar5 = uVar7;
        }
        return (type->width >> 3) * uVar2 * uVar5;
      }
      uVar6 = uVar5 * uVar7;
      uVar7 = type->width >> 3;
    }
    else {
      uVar4 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      uVar6 = get_declared_type_array_stride_msl(this,type,is_packed,row_major);
      uVar7 = uVar4 + (uVar4 == 0);
    }
    uVar6 = uVar7 * uVar6;
  }
  return uVar6;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_size_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Pointers take 8 bytes each
	// Match both pointer and array-of-pointer here.
	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
	{
		uint32_t type_size = 8;

		// Work our way through potentially layered arrays,
		// stopping when we hit a pointer that is not also an array.
		int32_t dim_idx = (int32_t)type.array.size() - 1;
		auto *p_type = &type;
		while (!is_pointer(*p_type) && dim_idx >= 0)
		{
			type_size *= to_array_size_literal(*p_type, dim_idx);
			p_type = &get<SPIRType>(p_type->parent_type);
			dim_idx--;
		}

		return type_size;
	}

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying size of opaque object.");

	default:
	{
		if (!type.array.empty())
		{
			uint32_t array_size = to_array_size_literal(type);
			return get_declared_type_array_stride_msl(type, is_packed, row_major) * max<uint32_t>(array_size, 1u);
		}

		if (type.basetype == SPIRType::Struct)
			return get_declared_struct_size_msl(type);

		if (is_packed)
		{
			return type.vecsize * type.columns * (type.width / 8);
		}
		else
		{
			// An unpacked 3-element vector or matrix column is the same memory size as a 4-element.
			uint32_t vecsize = type.vecsize;
			uint32_t columns = type.columns;

			if (row_major && columns > 1)
				swap(vecsize, columns);

			if (vecsize == 3)
				vecsize = 4;

			return vecsize * columns * (type.width / 8);
		}
	}
	}
}